

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::BinaryExpr<const_double_&,_const_Catch::Detail::Approx_&>::streamReconstructedExpression
          (BinaryExpr<const_double_&,_const_Catch::Detail::Approx_&> *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  Approx *value;
  string *in_R9;
  StringRef op;
  string local_60;
  string local_40;
  
  Detail::stringify<double>(&local_40,this->m_lhs);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  StringMaker<Catch::Detail::Approx,void>::convert_abi_cxx11_
            (&local_60,(StringMaker<Catch::Detail::Approx,void> *)this->m_rhs,value);
  op.m_size = (size_type)&local_60;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_40,lhs,op,in_R9);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }